

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeView.cc
# Opt level: O2

vector<unsigned_short,_std::allocator<unsigned_short>_> * __thiscall
NodeView::kmer_coverage
          (vector<unsigned_short,_std::allocator<unsigned_short>_> *__return_storage_ptr__,
          NodeView *this,int kcovds_idx,int kcovds_count_idx)

{
  pointer pKVar1;
  string local_40;
  
  pKVar1 = (this->dg->sdg->ws->kmer_counters).
           super__Vector_base<KmerCounter,_std::allocator<KmerCounter>_>._M_impl.
           super__Vector_impl_data._M_start;
  sequence_abi_cxx11_(&local_40,this);
  KmerCounter::project_count
            (__return_storage_ptr__,pKVar1 + kcovds_count_idx,(uint16_t)kcovds_count_idx,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint16_t> NodeView::kmer_coverage(int kcovds_idx, int kcovds_count_idx) const {
    return dg->sdg.ws.kmer_counters[kcovds_count_idx].project_count(kcovds_count_idx,sequence());
}